

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall xLearn::OndiskReader::SetShuffle(OndiskReader *this,bool shuffle)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  Logger local_5c;
  string local_58;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000031,shuffle) != 0) {
    local_5c.severity_ = ERR;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader.h"
               ,"");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"SetShuffle","");
    poVar1 = Logger::Start(ERR,&local_38,0x120,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Cannot set shuffle for OndiskReader.",0x24);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    Logger::~Logger(&local_5c);
  }
  (this->super_Reader).shuffle_ = false;
  return;
}

Assistant:

void inline SetShuffle(bool shuffle) {
    if (shuffle == true) {
      LOG(ERR) << "Cannot set shuffle for OndiskReader.";
    }
    this->shuffle_ = false;
  }